

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O3

bool __thiscall
TasGrid::GridWavelet::addParent(GridWavelet *this,int *point,int direction,Data2D<int> *destination)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int c;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_51;
  int *local_50 [2];
  long local_40;
  vector<int,std::allocator<int>> *local_38;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_50,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_51);
  iVar1 = RuleWavelet::getParent(&this->rule1D,point[direction]);
  local_50[0][direction] = iVar1;
  if (iVar1 == -2) {
    local_38 = (vector<int,std::allocator<int>> *)&destination->vec;
    bVar3 = false;
    iVar1 = 0;
    while( true ) {
      iVar2 = RuleWavelet::getNumPoints(&this->rule1D,0);
      if (iVar2 <= iVar1) break;
      local_50[0][direction] = iVar1;
      iVar2 = MultiIndexSet::getSlot(&(this->super_BaseCanonicalGrid).points,local_50[0]);
      if (iVar2 == -1) {
        ::std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  (local_38,(destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish,local_50[0],
                   local_50[0] + destination->stride);
        destination->num_strips = destination->num_strips + 1;
        bVar3 = true;
      }
      iVar1 = iVar1 + 1;
    }
  }
  else {
    if (-1 < iVar1) {
      iVar1 = MultiIndexSet::getSlot(&(this->super_BaseCanonicalGrid).points,local_50[0]);
      if (iVar1 == -1) {
        ::std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&destination->vec,
                   (destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_50[0],local_50[0] + destination->stride);
        destination->num_strips = destination->num_strips + 1;
        bVar3 = true;
        goto LAB_0016fec2;
      }
    }
    bVar3 = false;
  }
LAB_0016fec2:
  if (local_50[0] != (int *)0x0) {
    operator_delete(local_50[0],local_40 - (long)local_50[0]);
  }
  return bVar3;
}

Assistant:

bool GridWavelet::addParent(const int point[], int direction, Data2D<int> &destination) const{
    std::vector<int> dad(point, point + num_dimensions);
    bool added = false;
    dad[direction] = rule1D.getParent(point[direction]);
    if (dad[direction] == -2){
        for(int c=0; c<rule1D.getNumPoints(0); c++){
            dad[direction] = c;
            if (points.missing(dad)){
                destination.appendStrip(dad);
                added = true;
            }
        }
    }else if (dad[direction] >= 0){
        if (points.missing(dad)){
            destination.appendStrip(dad);
            added = true;
        }
    }
    return added;
}